

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtarga.c
# Opt level: O1

void put_pixel_rows(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  _func_void_j_decompress_ptr_djpeg_dest_ptr *p_Var1;
  JSAMPROW pJVar2;
  JDIMENSION JVar3;
  tga_dest_ptr dest;
  long lVar4;
  
  JVar3 = cinfo->output_width;
  if (JVar3 != 0) {
    p_Var1 = dinfo[1].start_output;
    pJVar2 = *dinfo->buffer;
    lVar4 = 0;
    do {
      p_Var1[lVar4] = (_func_void_j_decompress_ptr_djpeg_dest_ptr)pJVar2[lVar4 + 2];
      p_Var1[lVar4 + 1] = (_func_void_j_decompress_ptr_djpeg_dest_ptr)pJVar2[lVar4 + 1];
      p_Var1[lVar4 + 2] = (_func_void_j_decompress_ptr_djpeg_dest_ptr)pJVar2[lVar4];
      lVar4 = lVar4 + 3;
      JVar3 = JVar3 - 1;
    } while (JVar3 != 0);
  }
  fwrite(dinfo[1].start_output,1,(ulong)*(uint *)&dinfo[1].put_pixel_rows,(FILE *)dinfo->output_file
        );
  return;
}

Assistant:

METHODDEF(void)
put_pixel_rows(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
               JDIMENSION rows_supplied)
/* used for unquantized full-color output */
{
  tga_dest_ptr dest = (tga_dest_ptr)dinfo;
  register JSAMPROW inptr;
  register char *outptr;
  register JDIMENSION col;

  inptr = dest->pub.buffer[0];
  outptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    outptr[0] = inptr[2]; /* RGB to BGR order */
    outptr[1] = inptr[1];
    outptr[2] = inptr[0];
    inptr += 3, outptr += 3;
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}